

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

unique_ptr<Catch::ColourImpl> __thiscall
Catch::makeColourImpl(Catch *this,ColourMode implSelection,IStream *stream)

{
  _Alloc_hider _Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined7 in_register_00000031;
  IStream *stream_local;
  string local_48;
  ReusableStringStream local_28;
  
  iVar2 = (int)CONCAT71(in_register_00000031,implSelection);
  stream_local = stream;
  if (iVar2 == 0) {
    iVar2 = (*stream->_vptr_IStream[3])(stream);
    if ((char)iVar2 != '\0') {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      iVar3 = isatty(1);
      *piVar4 = iVar2;
      if (iVar3 != 0) goto LAB_0014a95e;
    }
  }
  else if (iVar2 != 3) {
    if (iVar2 != 1) {
      ReusableStringStream::ReusableStringStream(&local_28);
      std::operator<<(local_28.m_oss,"Could not create colour impl for selection ");
      std::ostream::operator<<(local_28.m_oss,(uint)implSelection);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_48);
    }
LAB_0014a95e:
    Detail::make_unique<Catch::(anonymous_namespace)::ANSIColourImpl,Catch::IStream*&>
              ((Detail *)&local_48,&stream_local);
    _Var1._M_p = local_48._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)0x0;
    *(pointer *)this = _Var1._M_p;
    Detail::unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl>::~unique_ptr
              ((unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl> *)&local_48);
    return (unique_ptr<Catch::ColourImpl>)(ColourImpl *)this;
  }
  Detail::make_unique<Catch::(anonymous_namespace)::NoColourImpl,Catch::IStream*&>
            ((Detail *)&local_48,&stream_local);
  _Var1._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  *(pointer *)this = _Var1._M_p;
  Detail::unique_ptr<Catch::(anonymous_namespace)::NoColourImpl>::~unique_ptr
            ((unique_ptr<Catch::(anonymous_namespace)::NoColourImpl> *)&local_48);
  return (unique_ptr<Catch::ColourImpl>)(ColourImpl *)this;
}

Assistant:

Detail::unique_ptr<ColourImpl> makeColourImpl( ColourMode implSelection,
                                                   IStream* stream ) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
        if ( implSelection == ColourMode::Win32 ) {
            return Detail::make_unique<Win32ColourImpl>( stream );
        }
#endif
        if ( implSelection == ColourMode::ANSI ) {
            return Detail::make_unique<ANSIColourImpl>( stream );
        }
        if ( implSelection == ColourMode::None ) {
            return Detail::make_unique<NoColourImpl>( stream );
        }

        if ( implSelection == ColourMode::PlatformDefault) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
            if ( Win32ColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<Win32ColourImpl>( stream );
            }
#endif
            if ( ANSIColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<ANSIColourImpl>( stream );
            }
            return Detail::make_unique<NoColourImpl>( stream );
        }

        CATCH_ERROR( "Could not create colour impl for selection " << static_cast<int>(implSelection) );
    }